

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

scalar __thiscall
absl::
make_unique<s2builderutil::NormalizeClosedSetImpl::DimensionLayer,int&,S2Builder::GraphOptions_const&,std::shared_ptr<s2builderutil::NormalizeClosedSetImpl>&>
          (absl *this,int *args,GraphOptions *args_1,
          shared_ptr<s2builderutil::NormalizeClosedSetImpl> *args_2)

{
  EdgeType dimension;
  shared_ptr<s2builderutil::NormalizeClosedSetImpl> *graph_options;
  DimensionLayer *this_00;
  shared_ptr<s2builderutil::NormalizeClosedSetImpl> local_38;
  shared_ptr<s2builderutil::NormalizeClosedSetImpl> *local_28;
  shared_ptr<s2builderutil::NormalizeClosedSetImpl> *args_local_2;
  GraphOptions *args_local_1;
  int *args_local;
  
  local_28 = args_2;
  args_local_2 = (shared_ptr<s2builderutil::NormalizeClosedSetImpl> *)args_1;
  args_local_1 = (GraphOptions *)args;
  args_local = (int *)this;
  this_00 = (DimensionLayer *)operator_new(0x30);
  graph_options = args_local_2;
  dimension = args_local_1->edge_type_;
  std::shared_ptr<s2builderutil::NormalizeClosedSetImpl>::shared_ptr(&local_38,local_28);
  s2builderutil::NormalizeClosedSetImpl::DimensionLayer::DimensionLayer
            (this_00,dimension,(GraphOptions *)graph_options,&local_38);
  std::
  unique_ptr<s2builderutil::NormalizeClosedSetImpl::DimensionLayer,std::default_delete<s2builderutil::NormalizeClosedSetImpl::DimensionLayer>>
  ::unique_ptr<std::default_delete<s2builderutil::NormalizeClosedSetImpl::DimensionLayer>,void>
            ((unique_ptr<s2builderutil::NormalizeClosedSetImpl::DimensionLayer,std::default_delete<s2builderutil::NormalizeClosedSetImpl::DimensionLayer>>
              *)this,this_00);
  std::shared_ptr<s2builderutil::NormalizeClosedSetImpl>::~shared_ptr(&local_38);
  return (__uniq_ptr_data<s2builderutil::NormalizeClosedSetImpl::DimensionLayer,_std::default_delete<s2builderutil::NormalizeClosedSetImpl::DimensionLayer>,_true,_true>
          )(__uniq_ptr_data<s2builderutil::NormalizeClosedSetImpl::DimensionLayer,_std::default_delete<s2builderutil::NormalizeClosedSetImpl::DimensionLayer>,_true,_true>
            )this;
}

Assistant:

typename memory_internal::MakeUniqueResult<T>::scalar make_unique(
    Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}